

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O3

string * __thiscall
cfd::core::TapBranch::ToString_abi_cxx11_(string *__return_storage_ptr__,TapBranch *this)

{
  undefined **ppuVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  string *psVar3;
  pointer puVar4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  undefined8 *puVar8;
  HashUtil *pHVar9;
  _func_int **pp_Var10;
  size_type *psVar11;
  ulong *puVar12;
  undefined8 uVar13;
  _Alloc_hider _Var14;
  pointer this_00;
  string buf;
  string ver_str;
  ByteData tapbranch_base;
  ByteData256 node;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  string local_1c8;
  undefined1 local_1a8 [8];
  undefined8 uStack_1a0;
  _func_int *local_198;
  pointer puStack_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string *local_138;
  string local_130;
  undefined1 local_110 [40];
  ByteData256 local_e8;
  string local_d0;
  pointer local_b0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_90;
  ByteData local_78;
  ByteData256 local_60;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_48;
  
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
  local_138 = __return_storage_ptr__;
  if (this->has_leaf_ == true) {
    ppuVar1 = (undefined **)(local_110 + 0x10);
    local_110._8_8_ = 0;
    local_110[0x10] = '\0';
    local_110._0_8_ = ppuVar1;
    if (this->leaf_version_ != 0xc0) {
      ByteData::ByteData((ByteData *)&local_158,this->leaf_version_);
      ByteData::GetHex_abi_cxx11_(&local_1c8,(ByteData *)&local_158);
      plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x5d5e2a);
      pp_Var10 = (_func_int **)(plVar7 + 2);
      if ((_func_int **)*plVar7 == pp_Var10) {
        local_198 = *pp_Var10;
        puStack_190 = (pointer)plVar7[3];
        local_1a8 = (undefined1  [8])&local_198;
      }
      else {
        local_198 = *pp_Var10;
        local_1a8 = (undefined1  [8])*plVar7;
      }
      uStack_1a0 = (pointer)plVar7[1];
      *plVar7 = (long)pp_Var10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_110,(string *)local_1a8);
      if (local_1a8 != (undefined1  [8])&local_198) {
        operator_delete((void *)local_1a8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_158._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_158._M_dataplus._M_p);
      }
    }
    Script::GetHex_abi_cxx11_(&local_130,&this->script_);
    ::std::operator+(&local_158,"tl(",&local_130);
    puVar8 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_158,local_110._0_8_);
    psVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar11) {
      local_1c8.field_2._M_allocated_capacity = *psVar11;
      local_1c8.field_2._8_8_ = puVar8[3];
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    }
    else {
      local_1c8.field_2._M_allocated_capacity = *psVar11;
      local_1c8._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_1c8._M_string_length = puVar8[1];
    *puVar8 = psVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1c8);
    pp_Var10 = (_func_int **)(puVar8 + 2);
    if ((_func_int **)*puVar8 == pp_Var10) {
      local_198 = *pp_Var10;
      puStack_190 = (pointer)puVar8[3];
      local_1a8 = (undefined1  [8])&local_198;
    }
    else {
      local_198 = *pp_Var10;
      local_1a8 = (undefined1  [8])*puVar8;
    }
    uStack_1a0 = (pointer)puVar8[1];
    *puVar8 = pp_Var10;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_1a8);
    if (local_1a8 != (undefined1  [8])&local_198) {
      operator_delete((void *)local_1a8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_158._M_dataplus._M_p != &local_158.field_2) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if ((undefined **)local_110._0_8_ != ppuVar1) {
LAB_0035bebf:
      operator_delete((void *)local_110._0_8_);
    }
  }
  else {
    if (((this->branch_list_).
         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
         super__Vector_impl_data._M_start ==
         (this->branch_list_).
         super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (bVar5 = ByteData256::IsEmpty(&this->root_commitment_), bVar5)) {
      (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_138,"");
      goto LAB_0035c62e;
    }
    ByteData256::GetHex_abi_cxx11_((string *)local_110,&this->root_commitment_);
    ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_110);
    if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) goto LAB_0035bebf;
  }
  if ((this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->branch_list_).
      super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&local_138->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (local_138->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    local_138->_M_string_length = local_178._M_string_length;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  }
  else {
    GetBaseHash(&local_e8,this);
    if ((ToString[abi:cxx11]()::kTaggedHash == '\0') &&
       (iVar6 = __cxa_guard_acquire(&ToString[abi:cxx11]()::kTaggedHash), iVar6 != 0)) {
      local_110._0_8_ = local_110 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_110,"TapBranch","");
      HashUtil::Sha256(&ToString::kTaggedHash,(string *)local_110);
      if ((undefined1 *)local_110._0_8_ != local_110 + 0x10) {
        operator_delete((void *)local_110._0_8_);
      }
      __cxa_atexit(ByteData256::~ByteData256,&ToString::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&ToString[abi:cxx11]()::kTaggedHash);
    }
    ByteData256::Concat<cfd::core::ByteData256>
              (&local_78,&ToString::kTaggedHash,&ToString::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&local_48,this);
    this_00 = (this->branch_list_).
              super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
              _M_impl.super__Vector_impl_data._M_start;
    local_b0 = (this->branch_list_).
               super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    if (this_00 != local_b0) {
      paVar2 = &local_158.field_2;
      do {
        HashUtil::HashUtil((HashUtil *)local_1a8,'\x03');
        pHVar9 = HashUtil::operator<<((HashUtil *)local_1a8,&local_78);
        HashUtil::HashUtil((HashUtil *)local_110,pHVar9);
        local_1a8 = (undefined1  [8])&PTR__HashUtil_0072e668;
        if (local_198 != (_func_int *)0x0) {
          operator_delete(local_198);
        }
        GetBranchHash(&local_60,this_00,
                      (char)((uint)(*(int *)&(this_00->branch_list_).
                                             super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                             ._M_impl.super__Vector_impl_data._M_finish -
                                   *(int *)&(this_00->branch_list_).
                                            super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>
                                            ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x11
                     );
        ByteData256::GetBytes(&local_90,&local_60);
        ByteData256::GetBytes(&local_a8,&local_e8);
        bVar5 = ::std::__lexicographical_compare<true>::__lc<unsigned_char,unsigned_char>
                          (local_a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           local_a8.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish,
                           local_90.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start,
                           local_90.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
        if (bVar5) {
          pHVar9 = HashUtil::operator<<((HashUtil *)local_110,&local_e8);
          pHVar9 = HashUtil::operator<<(pHVar9,&local_60);
          HashUtil::Output256((ByteData256 *)local_1a8,pHVar9);
          puVar4 = local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = uStack_1a0;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_198;
          local_1a8 = (undefined1  [8])0x0;
          uStack_1a0._0_1_ = '\0';
          uStack_1a0._1_7_ = 0;
          local_198 = (_func_int *)0x0;
          if (((_func_int **)puVar4 != (_func_int **)0x0) &&
             (operator_delete(puVar4), local_1a8 != (undefined1  [8])0x0)) {
            operator_delete((void *)local_1a8);
          }
          ::std::operator+(&local_130,"{",&local_178);
          plVar7 = (long *)::std::__cxx11::string::append((char *)&local_130);
          puVar12 = (ulong *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_158.field_2._M_allocated_capacity = *puVar12;
            local_158.field_2._8_8_ = plVar7[3];
            local_158._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *puVar12;
            local_158._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_158._M_string_length = plVar7[1];
          *plVar7 = (long)puVar12;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          ToString_abi_cxx11_(&local_d0,this_00);
          uVar13 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar2) {
            uVar13 = local_158.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar13 < local_158._M_string_length + local_d0._M_string_length) {
            uVar13 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              uVar13 = local_d0.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar13 < local_158._M_string_length + local_d0._M_string_length)
            goto LAB_0035c239;
            puVar8 = (undefined8 *)
                     ::std::__cxx11::string::replace
                               ((ulong)&local_d0,0,(char *)0x0,(ulong)local_158._M_dataplus._M_p);
          }
          else {
LAB_0035c239:
            puVar8 = (undefined8 *)
                     ::std::__cxx11::string::_M_append
                               ((char *)&local_158,(ulong)local_d0._M_dataplus._M_p);
          }
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          psVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1c8.field_2._M_allocated_capacity = *psVar11;
            local_1c8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *psVar11;
            local_1c8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1c8._M_string_length = puVar8[1];
          *puVar8 = psVar11;
          puVar8[1] = 0;
          *(undefined1 *)psVar11 = 0;
          puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1c8);
          pp_Var10 = (_func_int **)(puVar8 + 2);
          if ((_func_int **)*puVar8 == pp_Var10) {
            local_198 = *pp_Var10;
            puStack_190 = (pointer)puVar8[3];
            local_1a8 = (undefined1  [8])&local_198;
          }
          else {
            local_198 = *pp_Var10;
            local_1a8 = (undefined1  [8])*puVar8;
          }
          uStack_1a0 = (pointer)puVar8[1];
          *puVar8 = pp_Var10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          psVar3 = &local_130;
          _Var14._M_p = local_130._M_dataplus._M_p;
        }
        else {
          pHVar9 = HashUtil::operator<<((HashUtil *)local_110,&local_60);
          pHVar9 = HashUtil::operator<<(pHVar9,&local_e8);
          HashUtil::Output256((ByteData256 *)local_1a8,pHVar9);
          puVar4 = local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)local_1a8;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish = uStack_1a0;
          local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)local_198;
          local_1a8 = (undefined1  [8])0x0;
          uStack_1a0._0_1_ = '\0';
          uStack_1a0._1_7_ = 0;
          local_198 = (_func_int *)0x0;
          if (((_func_int **)puVar4 != (_func_int **)0x0) &&
             (operator_delete(puVar4), local_1a8 != (undefined1  [8])0x0)) {
            operator_delete((void *)local_1a8);
          }
          ToString_abi_cxx11_(&local_d0,this_00);
          plVar7 = (long *)::std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,0x5da24a);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar7 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130.field_2._8_8_ = plVar7[3];
          }
          else {
            local_130.field_2._M_allocated_capacity = *psVar11;
            local_130._M_dataplus._M_p = (pointer)*plVar7;
          }
          local_130._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_130);
          puVar12 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_158.field_2._M_allocated_capacity = *puVar12;
            local_158.field_2._8_8_ = puVar8[3];
            local_158._M_dataplus._M_p = (pointer)paVar2;
          }
          else {
            local_158.field_2._M_allocated_capacity = *puVar12;
            local_158._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_158._M_string_length = puVar8[1];
          *puVar8 = puVar12;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)
                   ::std::__cxx11::string::_M_append
                             ((char *)&local_158,(ulong)local_178._M_dataplus._M_p);
          local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
          psVar11 = puVar8 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar11) {
            local_1c8.field_2._M_allocated_capacity = *psVar11;
            local_1c8.field_2._8_8_ = puVar8[3];
          }
          else {
            local_1c8.field_2._M_allocated_capacity = *psVar11;
            local_1c8._M_dataplus._M_p = (pointer)*puVar8;
          }
          local_1c8._M_string_length = puVar8[1];
          *puVar8 = psVar11;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          puVar8 = (undefined8 *)::std::__cxx11::string::append((char *)&local_1c8);
          pp_Var10 = (_func_int **)(puVar8 + 2);
          if ((_func_int **)*puVar8 == pp_Var10) {
            local_198 = *pp_Var10;
            puStack_190 = (pointer)puVar8[3];
            local_1a8 = (undefined1  [8])&local_198;
          }
          else {
            local_198 = *pp_Var10;
            local_1a8 = (undefined1  [8])*puVar8;
          }
          uStack_1a0 = (pointer)puVar8[1];
          *puVar8 = pp_Var10;
          puVar8[1] = 0;
          *(undefined1 *)(puVar8 + 2) = 0;
          ::std::__cxx11::string::operator=((string *)&local_178,(string *)local_1a8);
          if (local_1a8 != (undefined1  [8])&local_198) {
            operator_delete((void *)local_1a8);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_158._M_dataplus._M_p != paVar2) {
            operator_delete(local_158._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          psVar3 = &local_d0;
          _Var14._M_p = local_d0._M_dataplus._M_p;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var14._M_p != &psVar3->field_2) {
          operator_delete(_Var14._M_p);
        }
        if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != (uchar *)0x0) {
          operator_delete(local_90.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        if (local_60.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
            .super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        local_110._0_8_ = &PTR__HashUtil_0072e668;
        if ((void *)CONCAT71(local_110._17_7_,local_110[0x10]) != (void *)0x0) {
          operator_delete((void *)CONCAT71(local_110._17_7_,local_110[0x10]));
        }
        this_00 = this_00 + 1;
      } while (this_00 != local_b0);
    }
    (local_138->_M_dataplus)._M_p = (pointer)&local_138->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&local_138->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (local_138->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (local_138->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    local_138->_M_string_length = local_178._M_string_length;
    local_178._M_string_length = 0;
    local_178.field_2._M_local_buf[0] = '\0';
    local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_48);
    if (local_78.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((_func_int **)
        local_e8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (_func_int **)0x0) {
      operator_delete(local_e8.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
LAB_0035c62e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  return local_138;
}

Assistant:

std::string TapBranch::ToString() const {
  std::string buf;
  if (has_leaf_) {
    std::string ver_str;
    if (leaf_version_ != TaprootScriptTree::kTapScriptLeafVersion) {
      ver_str = "," + ByteData(leaf_version_).GetHex();
    }
    buf = "tl(" + script_.GetHex() + ver_str + ")";
  } else if (branch_list_.empty() && root_commitment_.IsEmpty()) {
    return "";
  } else {
    buf = root_commitment_.GetHex();
  }
  if (branch_list_.empty()) return buf;

  ByteData256 hash = GetBaseHash();
  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  for (const auto& branch : branch_list_) {
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto node = branch.GetCurrentBranchHash();
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
      buf = "{" + buf + "," + branch.ToString() + "}";
    } else {
      hash = (hasher << node << hash).Output256();
      buf = "{" + branch.ToString() + "," + buf + "}";
    }
  }
  return buf;
}